

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

bool absl::lts_20250127::str_format_internal::anon_unknown_0::FloatToSink<double>
               (double v,FormatConversionSpecImpl *conv,FormatSinkImpl *sink)

{
  undefined4 uVar1;
  bool bVar2;
  FormatConversionChar FVar3;
  int iVar4;
  char *pcVar5;
  unsigned_long *puVar6;
  FormatSinkImpl *in_R9;
  Decomposed<double> decomposed_00;
  HexFloatTypeParams float_traits;
  Decomposed<double> DVar7;
  string_view str;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  char cVar8;
  char local_169;
  char local_161;
  size_t local_160;
  basic_string_view<char,_std::char_traits<char>_> local_158;
  char local_148 [8];
  size_t local_140;
  FormatSinkImpl *local_138;
  double local_130;
  HexFloatTypeParams local_128;
  byte local_111;
  char *pcStack_110;
  bool uppercase;
  undefined8 local_108;
  unsigned_long local_100;
  char *local_f8;
  undefined8 local_f0;
  FormatState local_e8;
  FormatConversionChar local_c1;
  undefined1 local_c0 [7];
  FormatConversionChar c;
  Buffer buffer;
  Decomposed<double> decomposed;
  size_t sStack_40;
  int exp;
  size_t precision;
  double dStack_30;
  char sign_char;
  double abs_v;
  FormatSinkImpl *sink_local;
  FormatConversionSpecImpl *conv_local;
  double v_local;
  
  precision._7_1_ = '\0';
  dStack_30 = v;
  abs_v = (double)sink;
  sink_local = (FormatSinkImpl *)conv;
  conv_local = (FormatConversionSpecImpl *)v;
  bVar2 = std::signbit(v);
  if (bVar2) {
    precision._7_1_ = '-';
    dStack_30 = -dStack_30;
  }
  else {
    bVar2 = FormatConversionSpecImpl::has_show_pos_flag((FormatConversionSpecImpl *)sink_local);
    if (bVar2) {
      precision._7_1_ = '+';
    }
    else {
      bVar2 = FormatConversionSpecImpl::has_sign_col_flag((FormatConversionSpecImpl *)sink_local);
      if (bVar2) {
        precision._7_1_ = ' ';
      }
    }
  }
  bVar2 = ConvertNonNumericFloats<double>
                    (precision._7_1_,dStack_30,(FormatConversionSpecImpl *)sink_local,
                     (FormatSinkImpl *)abs_v);
  if (!bVar2) {
    iVar4 = FormatConversionSpecImpl::precision((FormatConversionSpecImpl *)sink_local);
    if (iVar4 < 0) {
      local_160 = 6;
    }
    else {
      iVar4 = FormatConversionSpecImpl::precision((FormatConversionSpecImpl *)sink_local);
      local_160 = (size_t)iVar4;
    }
    sStack_40 = local_160;
    decomposed._12_4_ = 0;
    DVar7 = Decompose<double>(dStack_30);
    buffer.end = (char *)DVar7.mantissa;
    decomposed.mantissa._0_4_ = DVar7.exponent;
    local_c1 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)sink_local);
    if ((local_c1 == 8) || (local_c1 == 9)) {
      local_e8.sign_char = precision._7_1_;
      local_e8.precision = sStack_40;
      local_e8.conv = (FormatConversionSpecImpl *)sink_local;
      local_e8.sink = (FormatSinkImpl *)abs_v;
      FormatF<unsigned_long>((unsigned_long)buffer.end,(uint)decomposed.mantissa,&local_e8);
    }
    else {
      if ((local_c1 == 10) || (local_c1 == 0xb)) {
        local_f8 = buffer.end;
        local_f0 = CONCAT44(decomposed.mantissa._4_4_,(uint)decomposed.mantissa);
        DVar7._8_8_ = sStack_40;
        DVar7.mantissa = (ulong)(uint)decomposed.mantissa;
        bVar2 = str_format_internal::(anonymous_namespace)::
                FloatToBuffer<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,double>
                          ((_anonymous_namespace_ *)buffer.end,DVar7,(size_t)local_c0,
                           (Buffer *)&decomposed.field_0xc,(int *)in_R9);
        if (!bVar2) {
          bVar2 = FallbackToSnprintf<double>
                            ((double)conv_local,(FormatConversionSpecImpl *)sink_local,
                             (FormatSinkImpl *)abs_v);
          return bVar2;
        }
        bVar2 = FormatConversionSpecImpl::has_alt_flag((FormatConversionSpecImpl *)sink_local);
        if ((!bVar2) && (pcVar5 = Buffer::back((Buffer *)local_c0), *pcVar5 == '.')) {
          Buffer::pop_back((Buffer *)local_c0);
        }
        uVar1 = decomposed._12_4_;
        FVar3 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)sink_local);
        bVar2 = FormatConversionCharIsUpper(FVar3);
        local_161 = 'E';
        if (!bVar2) {
          local_161 = 'e';
        }
        PrintExponent(uVar1,local_161,(Buffer *)local_c0);
      }
      else {
        if ((local_c1 != 0xc) && (local_c1 != 0xd)) {
          if ((local_c1 != 0xe) && (local_c1 != 0xf)) {
            return false;
          }
          local_111 = local_c1 == 0xf;
          HexFloatTypeParams::HexFloatTypeParams<double>(&local_128,0.0);
          local_148[0] = precision._7_1_;
          local_140 = sStack_40;
          local_138 = sink_local;
          local_130 = abs_v;
          float_traits.leading_digit_size_bits = (size_t)buffer.end;
          float_traits._0_8_ = local_128.leading_digit_size_bits;
          FormatA<unsigned_long>
                    ((anon_unknown_0 *)(ulong)(uint)local_128.min_exponent,float_traits,
                     (ulong)(uint)decomposed.mantissa,(uint)(local_111 & 1),SUB81(local_148,0),
                     (FormatState *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
          return true;
        }
        local_100 = 1;
        puVar6 = std::max<unsigned_long>(&stack0xffffffffffffffc0,&local_100);
        sStack_40 = *puVar6 - 1;
        pcStack_110 = buffer.end;
        local_108 = CONCAT44(decomposed.mantissa._4_4_,(uint)decomposed.mantissa);
        decomposed_00._8_8_ = sStack_40;
        decomposed_00.mantissa = (ulong)(uint)decomposed.mantissa;
        bVar2 = str_format_internal::(anonymous_namespace)::
                FloatToBuffer<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,double>
                          ((_anonymous_namespace_ *)buffer.end,decomposed_00,(size_t)local_c0,
                           (Buffer *)&decomposed.field_0xc,(int *)in_R9);
        if (!bVar2) {
          bVar2 = FallbackToSnprintf<double>
                            ((double)conv_local,(FormatConversionSpecImpl *)sink_local,
                             (FormatSinkImpl *)abs_v);
          return bVar2;
        }
        if ((((int)decomposed._12_4_ < 0) || ((ulong)(long)(int)decomposed._12_4_ < sStack_40 + 1))
           && (-5 < (int)decomposed._12_4_)) {
          if ((int)decomposed._12_4_ < 0) {
            *(undefined1 *)(buffer._80_8_ + 1) = *(undefined1 *)buffer._80_8_;
            for (; (int)decomposed._12_4_ < -1; decomposed._12_4_ = decomposed._12_4_ + 1) {
              *(undefined1 *)buffer._80_8_ = 0x30;
              buffer._80_8_ = buffer._80_8_ + -1;
            }
            *(undefined1 *)buffer._80_8_ = 0x2e;
            *(undefined1 *)(buffer._80_8_ + -1) = 0x30;
            buffer._80_8_ = (undefined1 *)(buffer._80_8_ + -1);
          }
          else if (0 < (int)decomposed._12_4_) {
            std::_V2::rotate<char*>
                      ((char *)(buffer._80_8_ + 1),(char *)(buffer._80_8_ + 2),
                       (char *)(buffer._80_8_ + (long)(int)decomposed._12_4_ + 2));
          }
          decomposed._12_4_ = 0;
        }
        bVar2 = FormatConversionSpecImpl::has_alt_flag((FormatConversionSpecImpl *)sink_local);
        if (!bVar2) {
          while( true ) {
            pcVar5 = Buffer::back((Buffer *)local_c0);
            if (*pcVar5 != '0') break;
            Buffer::pop_back((Buffer *)local_c0);
          }
          pcVar5 = Buffer::back((Buffer *)local_c0);
          if (*pcVar5 == '.') {
            Buffer::pop_back((Buffer *)local_c0);
          }
        }
        uVar1 = decomposed._12_4_;
        if (decomposed._12_4_ != 0) {
          FVar3 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)sink_local);
          bVar2 = FormatConversionCharIsUpper(FVar3);
          local_169 = 'E';
          if (!bVar2) {
            local_169 = 'e';
          }
          PrintExponent(uVar1,local_169,(Buffer *)local_c0);
        }
      }
      cVar8 = precision._7_1_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_158,(char *)buffer._80_8_,(long)buffer.begin - buffer._80_8_);
      str._M_str = (char *)sink_local;
      str._M_len = (size_t)local_158._M_str;
      WriteBufferToSink((anon_unknown_0 *)(ulong)(uint)(int)cVar8,(char)local_158._M_len,str,
                        (FormatConversionSpecImpl *)abs_v,in_R9);
    }
  }
  return true;
}

Assistant:

bool FloatToSink(const Float v, const FormatConversionSpecImpl &conv,
                 FormatSinkImpl *sink) {
  // Print the sign or the sign column.
  Float abs_v = v;
  char sign_char = 0;
  if (std::signbit(abs_v)) {
    sign_char = '-';
    abs_v = -abs_v;
  } else if (conv.has_show_pos_flag()) {
    sign_char = '+';
  } else if (conv.has_sign_col_flag()) {
    sign_char = ' ';
  }

  // Print nan/inf.
  if (ConvertNonNumericFloats(sign_char, abs_v, conv, sink)) {
    return true;
  }

  size_t precision =
      conv.precision() < 0 ? 6 : static_cast<size_t>(conv.precision());

  int exp = 0;

  auto decomposed = Decompose(abs_v);

  Buffer buffer;

  FormatConversionChar c = conv.conversion_char();

  if (c == FormatConversionCharInternal::f ||
      c == FormatConversionCharInternal::F) {
    FormatF(decomposed.mantissa, decomposed.exponent,
            {sign_char, precision, conv, sink});
    return true;
  } else if (c == FormatConversionCharInternal::e ||
             c == FormatConversionCharInternal::E) {
    if (!FloatToBuffer<FormatStyle::Precision>(decomposed, precision, &buffer,
                                               &exp)) {
      return FallbackToSnprintf(v, conv, sink);
    }
    if (!conv.has_alt_flag() && buffer.back() == '.') buffer.pop_back();
    PrintExponent(
        exp, FormatConversionCharIsUpper(conv.conversion_char()) ? 'E' : 'e',
        &buffer);
  } else if (c == FormatConversionCharInternal::g ||
             c == FormatConversionCharInternal::G) {
    precision = std::max(precision, size_t{1}) - 1;
    if (!FloatToBuffer<FormatStyle::Precision>(decomposed, precision, &buffer,
                                               &exp)) {
      return FallbackToSnprintf(v, conv, sink);
    }
    if ((exp < 0 || precision + 1 > static_cast<size_t>(exp)) && exp >= -4) {
      if (exp < 0) {
        // Have 1.23456, needs 0.00123456
        // Move the first digit
        buffer.begin[1] = *buffer.begin;
        // Add some zeros
        for (; exp < -1; ++exp) *buffer.begin-- = '0';
        *buffer.begin-- = '.';
        *buffer.begin = '0';
      } else if (exp > 0) {
        // Have 1.23456, needs 1234.56
        // Move the '.' exp positions to the right.
        std::rotate(buffer.begin + 1, buffer.begin + 2, buffer.begin + exp + 2);
      }
      exp = 0;
    }
    if (!conv.has_alt_flag()) {
      while (buffer.back() == '0') buffer.pop_back();
      if (buffer.back() == '.') buffer.pop_back();
    }
    if (exp) {
      PrintExponent(
          exp, FormatConversionCharIsUpper(conv.conversion_char()) ? 'E' : 'e',
          &buffer);
    }
  } else if (c == FormatConversionCharInternal::a ||
             c == FormatConversionCharInternal::A) {
    bool uppercase = (c == FormatConversionCharInternal::A);
    FormatA(HexFloatTypeParams(Float{}), decomposed.mantissa,
            decomposed.exponent, uppercase, {sign_char, precision, conv, sink});
    return true;
  } else {
    return false;
  }

  WriteBufferToSink(
      sign_char,
      absl::string_view(buffer.begin,
                        static_cast<size_t>(buffer.end - buffer.begin)),
      conv, sink);

  return true;
}